

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalidModelUnsupportedLayersForBP(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  pointer pcVar1;
  float fVar2;
  WeightParams *pWVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion TVar10;
  Type *pTVar11;
  WeightParams *pWVar12;
  LayerUnion LVar13;
  NetworkUpdateParameters *this_01;
  Type *this_02;
  CategoricalCrossEntropyLossLayer *this_03;
  ostream *poVar14;
  Rep *pRVar15;
  int iVar16;
  int iVar17;
  Result res;
  Model m;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_58.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
    pFVar8 = pTVar7->type_;
    if (pFVar8 == (FeatureType *)0x0) {
      pFVar8 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar8);
      pTVar7->type_ = pFVar8;
    }
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x10020;
  this = &pAVar9->shape_;
  iVar17 = (pAVar9->shape_).current_size_;
  iVar16 = (pAVar9->shape_).total_size_;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar17 + 1);
    iVar17 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
  }
  pRVar15 = (pAVar9->shape_).rep_;
  iVar5 = iVar17 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar15->elements[iVar17] = 1;
  if (iVar5 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar17 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar16 = (pAVar9->shape_).total_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  iVar17 = iVar5 + 1;
  this->current_size_ = iVar17;
  pRVar15->elements[iVar5] = 1;
  if (iVar17 == iVar16) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar5 + 2);
    iVar17 = (pAVar9->shape_).current_size_;
    pRVar15 = (pAVar9->shape_).rep_;
  }
  this->current_size_ = iVar17 + 1;
  pRVar15->elements[iVar17] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_58.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x10020;
  local_58.isupdatable_ = true;
  local_58.specificationversion_ = 4;
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    TVar10.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar10.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = TVar10.pipelineclassifier_;
  }
  TVar10 = local_58.Type_;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_58.Type_.pipeline_)->models_;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"inner_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar11->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar11,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar11,"ip");
  pTVar11->isupdatable_ = true;
  if (pTVar11->_oneof_case_[0] == 0x8c) {
    LVar13 = pTVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar11);
    pTVar11->_oneof_case_[0] = 0x8c;
    LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(LVar13.innerproduct_);
    (pTVar11->layer_).innerproduct_ = (InnerProductLayerParams *)LVar13;
  }
  (LVar13.innerproduct_)->inputchannels_ = 1;
  (LVar13.innerproduct_)->outputchannels_ = 1;
  pWVar12 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).linear_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    ((LVar13.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar12;
  }
  fVar2 = (float)(pWVar12->floatvalue_).current_size_;
  if (fVar2 == (float)(pWVar12->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar12->floatvalue_,(int)fVar2 + 1);
    fVar2 = (float)(pWVar12->floatvalue_).current_size_;
    pWVar3 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).linear_;
    (pWVar12->floatvalue_).current_size_ = (int)fVar2 + 1;
    ((pWVar12->floatvalue_).rep_)->elements[(int)fVar2] = 1.0;
    pWVar12 = pWVar3;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar12);
      ((LVar13.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar12;
    }
  }
  else {
    (pWVar12->floatvalue_).current_size_ = (int)fVar2 + 1;
    ((pWVar12->floatvalue_).rep_)->elements[(int)fVar2] = 1.0;
  }
  pWVar12->isupdatable_ = true;
  (LVar13.innerproduct_)->hasbias_ = true;
  pWVar12 = (LVar13.innerproduct_)->bias_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    (LVar13.innerproduct_)->bias_ = pWVar12;
  }
  iVar17 = (pWVar12->floatvalue_).current_size_;
  if (iVar17 == (pWVar12->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar12->floatvalue_,iVar17 + 1);
    iVar17 = (pWVar12->floatvalue_).current_size_;
    pWVar3 = (LVar13.innerproduct_)->bias_;
    (pWVar12->floatvalue_).current_size_ = iVar17 + 1;
    ((pWVar12->floatvalue_).rep_)->elements[iVar17] = 1.0;
    pWVar12 = pWVar3;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar12);
      (LVar13.innerproduct_)->bias_ = pWVar12;
    }
  }
  else {
    (pWVar12->floatvalue_).current_size_ = iVar17 + 1;
    ((pWVar12->floatvalue_).rep_)->elements[iVar17] = 1.0;
  }
  pWVar12->isupdatable_ = true;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"abs_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar11->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar11,"ip");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar11,"abs_out");
  if (pTVar11->_oneof_case_[0] == 0xdc) {
    LVar13 = pTVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar11);
    pTVar11->_oneof_case_[0] = 0xdc;
    LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    CoreML::Specification::UnaryFunctionLayerParams::UnaryFunctionLayerParams(LVar13.unary_);
    (pTVar11->layer_).unary_ = (UnaryFunctionLayerParams *)LVar13;
  }
  ((LVar13.convolution_)->kernelsize_).current_size_ = 6;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"pooling_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar11->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar11,"abs_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar11,"B");
  if (pTVar11->_oneof_case_[0] == 0x78) {
    LVar13 = pTVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar11);
    pTVar11->_oneof_case_[0] = 0x78;
    LVar13.convolution_ = (ConvolutionLayerParams *)operator_new(0x58);
    CoreML::Specification::PoolingLayerParams::PoolingLayerParams(LVar13.pooling_);
    (pTVar11->layer_).pooling_ = (PoolingLayerParams *)LVar13;
  }
  (LVar13.pooling_)->type_ = 1;
  (LVar13.pooling_)->globalpooling_ = true;
  if ((LVar13.pooling_)->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(LVar13.pooling_);
    (LVar13.pooling_)->_oneof_case_[0] = 0x1e;
    pWVar12 = (WeightParams *)operator_new(0x20);
    CoreML::Specification::ValidPadding::ValidPadding((ValidPadding *)pWVar12);
    (LVar13.scale_)->bias_ = pWVar12;
  }
  this_01 = (TVar10.neuralnetworkregressor_)->updateparams_;
  if (this_01 == (NetworkUpdateParameters *)0x0) {
    this_01 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this_01);
    (TVar10.neuralnetworkregressor_)->updateparams_ = this_01;
  }
  this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this_01->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"loss_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_02->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (this_02->_oneof_case_[0] == 10) {
    this_03 = (this_02->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_02);
    this_02->_oneof_case_[0] = 10;
    this_03 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (this_03);
    (this_02->LossLayerType_).categoricalcrossentropylosslayer_ = this_03;
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_03->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"label_target","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_03->target_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Model::validate((Result *)local_80,&local_58);
  bVar4 = CoreML::Result::good((Result *)local_80);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar4;
}

Assistant:

int testInvalidModelUnsupportedLayersForBP() {

    /* checks if there are layers between updatable-marked layers and loss function that do not support back-propagation
     input ---> inner_product (U) ----> ABS (not supported for BP) ---> pooling --> output
     */


    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("ip");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    auto *l2 = nn->add_layers();
    l2->set_name("abs_layer");
    l2->add_input("ip");
    l2->add_output("abs_out");
    auto *elem = l2->mutable_unary();
    elem->set_type(Specification::UnaryFunctionLayerParams::ABS);

    auto *l3 = nn->add_layers();
    l3->set_name("pooling_layer");
    l3->add_input("abs_out");
    l3->add_output("B");
    auto *params = l3->mutable_pooling();
    params->set_type(::Specification::PoolingLayerParams::AVERAGE);
    params->set_globalpooling(true);
    params->mutable_valid();

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("loss_layer");

    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("B");
    ceLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}